

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

bitmask<slang::ast::IntegralFlags> __thiscall slang::ast::Type::getIntegralFlags(Type *this)

{
  undefined1 uVar1;
  bool bVar2;
  underlying_type uVar3;
  IntegralType *this_00;
  underlying_type uVar4;
  
  bVar2 = isIntegral(this);
  if (bVar2) {
    this_00 = (IntegralType *)this->canonical;
    if (this_00 == (IntegralType *)0x0) {
      this->canonical = this;
      this_00 = (IntegralType *)this;
      do {
        this_00 = (IntegralType *)DeclaredType::getType((DeclaredType *)&this_00->bitWidth);
        this->canonical = (Type *)this_00;
      } while ((this_00->super_Type).super_Symbol.kind == TypeAlias);
    }
    uVar1 = this_00->isSigned;
    uVar4 = uVar1 + '\x02';
    if (this_00->isFourState == false) {
      uVar4 = uVar1;
    }
    bVar2 = IntegralType::isDeclaredReg(this_00);
    uVar3 = uVar4 + '\x04';
    if (!bVar2) {
      uVar3 = uVar4;
    }
  }
  else {
    uVar3 = '\0';
  }
  return (bitmask<slang::ast::IntegralFlags>)uVar3;
}

Assistant:

bitmask<IntegralFlags> Type::getIntegralFlags() const {
    bitmask<IntegralFlags> flags;
    if (!isIntegral())
        return flags;

    const IntegralType& it = getCanonicalType().as<IntegralType>();
    if (it.isSigned)
        flags |= IntegralFlags::Signed;
    if (it.isFourState)
        flags |= IntegralFlags::FourState;
    if (it.isDeclaredReg())
        flags |= IntegralFlags::Reg;

    return flags;
}